

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

void google::protobuf::internal::SerializeMapKeyWithCachedSizes
               (FieldDescriptor *field,MapKey *value,CodedOutputStream *output)

{
  bool value_00;
  Type TVar1;
  uint32 uVar2;
  int32 iVar3;
  LogMessage *other;
  uint64 uVar4;
  int64 iVar5;
  string *value_01;
  LogFinisher local_65 [13];
  LogMessage local_58;
  CodedOutputStream *local_20;
  CodedOutputStream *output_local;
  MapKey *value_local;
  FieldDescriptor *field_local;
  
  local_20 = output;
  output_local = (CodedOutputStream *)value;
  value_local = (MapKey *)field;
  TVar1 = FieldDescriptor::type(field);
  switch(TVar1) {
  case TYPE_DOUBLE:
  case TYPE_FLOAT:
  case TYPE_GROUP:
  case TYPE_MESSAGE:
  case TYPE_BYTES:
  case TYPE_ENUM:
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x34e);
    other = LogMessage::operator<<(&local_58,"Unsupported");
    LogFinisher::operator=(local_65,other);
    LogMessage::~LogMessage(&local_58);
    break;
  case TYPE_INT64:
    iVar5 = MapKey::GetInt64Value((MapKey *)output_local);
    WireFormatLite::WriteInt64(1,iVar5,local_20);
    break;
  case TYPE_UINT64:
    uVar4 = MapKey::GetUInt64Value((MapKey *)output_local);
    WireFormatLite::WriteUInt64(1,uVar4,local_20);
    break;
  case TYPE_INT32:
    iVar3 = MapKey::GetInt32Value((MapKey *)output_local);
    WireFormatLite::WriteInt32(1,iVar3,local_20);
    break;
  case TYPE_FIXED64:
    uVar4 = MapKey::GetUInt64Value((MapKey *)output_local);
    WireFormatLite::WriteFixed64(1,uVar4,local_20);
    break;
  case TYPE_FIXED32:
    uVar2 = MapKey::GetUInt32Value((MapKey *)output_local);
    WireFormatLite::WriteFixed32(1,uVar2,local_20);
    break;
  case TYPE_BOOL:
    value_00 = MapKey::GetBoolValue((MapKey *)output_local);
    WireFormatLite::WriteBool(1,value_00,local_20);
    break;
  case TYPE_STRING:
    value_01 = MapKey::GetStringValue_abi_cxx11_((MapKey *)output_local);
    WireFormatLite::WriteString(1,value_01,local_20);
    break;
  case TYPE_UINT32:
    uVar2 = MapKey::GetUInt32Value((MapKey *)output_local);
    WireFormatLite::WriteUInt32(1,uVar2,local_20);
    break;
  case TYPE_SFIXED32:
    iVar3 = MapKey::GetInt32Value((MapKey *)output_local);
    WireFormatLite::WriteSFixed32(1,iVar3,local_20);
    break;
  case TYPE_SFIXED64:
    iVar5 = MapKey::GetInt64Value((MapKey *)output_local);
    WireFormatLite::WriteSFixed64(1,iVar5,local_20);
    break;
  case TYPE_SINT32:
    iVar3 = MapKey::GetInt32Value((MapKey *)output_local);
    WireFormatLite::WriteSInt32(1,iVar3,local_20);
    break;
  case MAX_TYPE:
    iVar5 = MapKey::GetInt64Value((MapKey *)output_local);
    WireFormatLite::WriteSInt64(1,iVar5,local_20);
  }
  return;
}

Assistant:

static void SerializeMapKeyWithCachedSizes(const FieldDescriptor* field,
                                           const MapKey& value,
                                           io::CodedOutputStream* output) {
  switch (field->type()) {
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_FLOAT:
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_BYTES:
    case FieldDescriptor::TYPE_ENUM:
      GOOGLE_LOG(FATAL) << "Unsupported";
      break;
#define CASE_TYPE(FieldType, CamelFieldType, CamelCppType)                     \
  case FieldDescriptor::TYPE_##FieldType:                                      \
    WireFormatLite::Write##CamelFieldType(1, value.Get##CamelCppType##Value(), \
                                          output);                             \
    break;
      CASE_TYPE(INT64, Int64, Int64)
      CASE_TYPE(UINT64, UInt64, UInt64)
      CASE_TYPE(INT32, Int32, Int32)
      CASE_TYPE(FIXED64, Fixed64, UInt64)
      CASE_TYPE(FIXED32, Fixed32, UInt32)
      CASE_TYPE(BOOL, Bool, Bool)
      CASE_TYPE(UINT32, UInt32, UInt32)
      CASE_TYPE(SFIXED32, SFixed32, Int32)
      CASE_TYPE(SFIXED64, SFixed64, Int64)
      CASE_TYPE(SINT32, SInt32, Int32)
      CASE_TYPE(SINT64, SInt64, Int64)
      CASE_TYPE(STRING, String, String)
#undef CASE_TYPE
  }
}